

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O1

string_t * __thiscall
cfgfile::tag_no_value_t<cfgfile::string_trait_t>::print_abi_cxx11_
          (string_t *__return_storage_ptr__,tag_no_value_t<cfgfile::string_trait_t> *this,int indent
          )

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char cVar4;
  undefined8 *puVar5;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined(&this->super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)indent);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    cVar4 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar4);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,
               (ulong)(this->super_tag_t<cfgfile::string_trait_t>).m_name._M_dataplus._M_p);
    iVar3 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(this);
    if (*(long *)CONCAT44(extraout_var,iVar3) != ((long *)CONCAT44(extraout_var,iVar3))[1]) {
      std::__cxx11::string::push_back(cVar4);
      local_38 = (long)indent;
      iVar3 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(this);
      puVar5 = *(undefined8 **)CONCAT44(extraout_var_00,iVar3);
      puVar1 = (undefined8 *)((long *)CONCAT44(extraout_var_00,iVar3))[1];
      if (puVar5 != puVar1) {
        do {
          (**(code **)(*(long *)*puVar5 + 0x18))(local_58,(long *)*puVar5,indent + 1);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
          if (local_58[0] != local_48) {
            operator_delete(local_58[0],local_48[0] + 1);
          }
          puVar5 = puVar5 + 1;
        } while (puVar5 != puVar1);
      }
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct((ulong)local_58,(char)local_38);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
    }
    std::__cxx11::string::push_back(cVar4);
    std::__cxx11::string::push_back(cVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}